

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

int __thiscall
CTcTokenizer::parse_macro_actuals
          (CTcTokenizer *this,CTcTokString *srcbuf,utf8_ptr *src,CTcHashEntryPp *entry,
          size_t *argofs,size_t *arglen,int read_more,int *found_actuals)

{
  tok_embed_ctx *ec;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  tc_toktyp_t tVar5;
  wchar_t wVar6;
  int iVar7;
  int iVar8;
  byte bVar9;
  byte *p;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  byte *pbVar13;
  byte *pbVar14;
  int iVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  CTcToken tok;
  ulong local_a0;
  CTcToken local_58;
  
  ec = &this->macro_in_embedding_;
  tVar5 = next_on_line(srcbuf,src,&local_58,ec,1);
  bVar16 = tVar5 == TOKT_EOF;
  bVar17 = read_more != 0;
  if (bVar17 && bVar16) {
    tVar5 = actual_splice_next_line(this,srcbuf,src,&local_58);
  }
  bVar2 = bVar17 && bVar16;
  if (tVar5 == TOKT_LPAR) {
    *argofs = (size_t)(local_58.text_ + (local_58.text_len_ - (long)srcbuf->buf_));
    tVar5 = next_on_line(srcbuf,src,&local_58,ec,1);
    local_a0 = 0;
    do {
      if (tVar5 == TOKT_RPAR) {
        tVar5 = TOKT_RPAR;
        break;
      }
      iVar7 = (int)local_a0;
      if (iVar7 < entry->argc_) {
        if (iVar7 < 0x80) goto LAB_00257bb8;
LAB_00257cad:
        log_error(0x2731,(ulong)(uint)(entry->super_CVmHashEntryCS).super_CVmHashEntry.len_,
                  (entry->super_CVmHashEntryCS).super_CVmHashEntry.str_);
        while ((tVar5 != TOKT_EOF && (tVar5 != TOKT_RPAR))) {
          tVar5 = next_on_line(srcbuf,src,&local_58,ec,1);
        }
        uVar11 = 0;
      }
      else {
        if (0x7f < iVar7 || (entry->field_0x44 & 2) == 0) goto LAB_00257cad;
LAB_00257bb8:
        iVar12 = 0;
        iVar15 = 0;
        iVar8 = 0;
        do {
          bVar3 = iVar12 == 0;
          bVar4 = iVar8 == 0;
          bVar17 = tVar5 == TOKT_COMMA;
          bVar16 = iVar15 == 0;
          if (((bVar3 && bVar4) && bVar17) && bVar16) {
            bVar18 = false;
            tVar5 = TOKT_COMMA;
            goto LAB_00257d01;
          }
          if (tVar5 == TOKT_RPAR && iVar12 == 0) {
            tVar5 = TOKT_RPAR;
            bVar9 = 1;
            bVar18 = false;
            goto LAB_00257d0f;
          }
          switch(tVar5) {
          case TOKT_LPAR:
            iVar12 = iVar12 + 1;
            break;
          case TOKT_RPAR:
            iVar12 = iVar12 + -1;
            break;
          case TOKT_LBRACE:
            iVar8 = iVar8 + 1;
            break;
          case TOKT_RBRACE:
            iVar8 = iVar8 + -1;
            break;
          case TOKT_LBRACK:
            iVar15 = iVar15 + 1;
            break;
          case TOKT_RBRACK:
            iVar15 = iVar15 + -1;
          }
          tVar5 = next_on_line(srcbuf,src,&local_58,ec,1);
          if (tVar5 == TOKT_EOF && read_more != 0) {
            tVar5 = actual_splice_next_line(this,srcbuf,src,&local_58);
            bVar2 = true;
          }
        } while (tVar5 != TOKT_EOF);
        tVar5 = TOKT_EOF;
        bVar18 = true;
LAB_00257d01:
        bVar9 = 0;
LAB_00257d0f:
        uVar11 = 0;
        if (bVar18) {
          tVar5 = TOKT_EOF;
        }
        else {
          pbVar13 = (byte *)local_58.text_;
          do {
            if (pbVar13 <= srcbuf->buf_ + argofs[iVar7]) break;
            bVar1 = pbVar13[-1 - (ulong)(~(uint)(pbVar13[-1] >> 6) & (uint)(pbVar13[-1] >> 7))];
            pbVar13 = pbVar13 + (-1 - (ulong)(~(uint)(pbVar13[-1] >> 6) & (uint)(pbVar13[-1] >> 7)))
                      + -(ulong)(~(uint)(bVar1 >> 6) & (uint)(bVar1 >> 7));
            wVar6 = utf8_ptr::s_getch((char *)pbVar13);
            bVar18 = true;
            if ((uint)wVar6 < 0x80) {
              iVar8 = isspace(wVar6);
              bVar18 = iVar8 == 0;
            }
            if (bVar18) {
              pbVar13 = pbVar13 + (ulong)(((*pbVar13 >> 5 & 1) != 0) + 1 & (uint)(*pbVar13 >> 7) * 3
                                         ) + 1;
              if (uVar11 != 0 && wVar6 == L'\\') {
                pbVar13 = pbVar13 + (ulong)(((*pbVar13 >> 5 & 1) != 0) + 1 &
                                           (uint)(*pbVar13 >> 7) * 3) + 1;
              }
            }
            else {
              uVar11 = uVar11 + 1;
            }
          } while (!bVar18);
          arglen[iVar7] = (long)pbVar13 - (long)(srcbuf->buf_ + argofs[iVar7]);
          local_a0 = (ulong)(iVar7 + 1U);
          if (((bVar3 && bVar4) && bVar17) && bVar16) {
            argofs[(int)(iVar7 + 1U)] =
                 (size_t)(local_58.text_ + (local_58.text_len_ - (long)srcbuf->buf_));
            tVar5 = next_on_line(srcbuf,src,&local_58,ec,1);
            uVar11 = 1;
          }
          else {
            if (bVar9 != 0) {
              tVar5 = TOKT_RPAR;
            }
            uVar11 = (uint)(bVar9 ^ 1);
          }
        }
      }
    } while ((char)uVar11 != '\0');
    if (tVar5 == TOKT_RPAR) {
      if (0 < (int)local_a0) {
        uVar10 = 0;
        do {
          pbVar14 = (byte *)(srcbuf->buf_ + argofs[uVar10]);
          pbVar13 = pbVar14 + arglen[uVar10];
          p = pbVar14;
          if (0 < (long)arglen[uVar10]) {
            do {
              wVar6 = utf8_ptr::s_getch((char *)p);
              if ((0x7f < (uint)wVar6) || (iVar7 = isspace(wVar6), iVar7 == 0)) break;
              p = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
            } while (p < pbVar13);
          }
          argofs[uVar10] = argofs[uVar10] + ((long)p - (long)pbVar14);
          arglen[uVar10] = arglen[uVar10] - ((long)p - (long)pbVar14);
          iVar7 = 0;
          pbVar14 = pbVar13;
          do {
            if (pbVar14 <= p) break;
            bVar9 = pbVar14[-1 - (ulong)(~(uint)(pbVar14[-1] >> 6) & (uint)(pbVar14[-1] >> 7))];
            pbVar14 = pbVar14 + (-1 - (ulong)(~(uint)(pbVar14[-1] >> 6) & (uint)(pbVar14[-1] >> 7)))
                      + -(ulong)(~(uint)(bVar9 >> 6) & (uint)(bVar9 >> 7));
            wVar6 = utf8_ptr::s_getch((char *)pbVar14);
            bVar16 = true;
            if ((uint)wVar6 < 0x80) {
              iVar8 = isspace(wVar6);
              bVar16 = iVar8 == 0;
            }
            if (bVar16) {
              pbVar14 = pbVar14 + (ulong)(((*pbVar14 >> 5 & 1) != 0) + 1 & (uint)(*pbVar14 >> 7) * 3
                                         ) + 1;
              if (iVar7 != 0 && wVar6 == L'\\') {
                pbVar14 = pbVar14 + (ulong)(((*pbVar14 >> 5 & 1) != 0) + 1 &
                                           (uint)(*pbVar14 >> 7) * 3) + 1;
              }
            }
            else {
              iVar7 = iVar7 + 1;
            }
          } while (!bVar16);
          arglen[uVar10] = (size_t)(pbVar14 + (arglen[uVar10] - (long)pbVar13));
          uVar10 = uVar10 + 1;
        } while (uVar10 != local_a0);
      }
      if (bVar2) {
        unsplice_line(this,local_58.text_ + local_58.text_len_);
      }
      if ((int)local_a0 < (int)((char)(entry->field_0x44 << 6) >> 7) + entry->argc_) {
        if ((int)local_a0 < entry->argc_) {
          local_a0 = (ulong)(int)local_a0;
          do {
            argofs[local_a0] = 0;
            arglen[local_a0] = 0;
            local_a0 = local_a0 + 1;
          } while ((long)local_a0 < (long)entry->argc_);
        }
        log_warning(0x272f,(ulong)(uint)(entry->super_CVmHashEntryCS).super_CVmHashEntry.len_,
                    (entry->super_CVmHashEntryCS).super_CVmHashEntry.str_);
      }
      if (((entry->field_0x44 & 2) != 0) && ((int)local_a0 < 0x80)) {
        argofs[(int)local_a0] = 0;
        arglen[(int)local_a0] = 0;
      }
      *found_actuals = 1;
      iVar7 = 0;
    }
    else {
      log_error((uint)(read_more != 0) * 3 + 0x272d,
                (ulong)(uint)(entry->super_CVmHashEntryCS).super_CVmHashEntry.len_,
                (entry->super_CVmHashEntryCS).super_CVmHashEntry.str_);
      iVar7 = 1;
    }
  }
  else {
    *found_actuals = 0;
    iVar7 = 0;
    if (bVar17 && bVar16) {
      unsplice_line(this,local_58.text_);
    }
  }
  return iVar7;
}

Assistant:

int CTcTokenizer::parse_macro_actuals(const CTcTokString *srcbuf,
                                      utf8_ptr *src,
                                      const CTcHashEntryPp *entry,
                                      size_t argofs[TOK_MAX_MACRO_ARGS],
                                      size_t arglen[TOK_MAX_MACRO_ARGS],
                                      int read_more, int *found_actuals)
{
    tc_toktyp_t typ;
    CTcToken tok;
    int argc;
    int spliced;
    int i;

    /* presume we're not going to do any line splicing */
    spliced = FALSE;

    /* no arguments parsed yet */
    argc = 0;

    /* get the next token after the macro symbol */
    typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_, TRUE);

    /* splice another line if necessary */
    if (typ == TOKT_EOF && read_more)
    {
        /* splice a line */
        typ = actual_splice_next_line(srcbuf, src, &tok);

        /* note the splice */
        spliced = TRUE;
    }

    /* if we didn't find an open paren, there's no actual list after all */
    if (typ != TOKT_LPAR)
    {
        /* tell the caller we didn't find any actuals */
        *found_actuals = FALSE;

        /* if we spliced a line, unsplice it at the current token */
        if (spliced)
            unsplice_line(tok.get_text());

        /* return success */
        return 0;
    }

    /* remember the offset of the start of the first argument */
    argofs[argc] = tok.get_text() + tok.get_text_len() - srcbuf->get_text();

    /* skip the open paren */
    typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_, TRUE);

    /* read the arguments */
    while (typ != TOKT_RPAR)
    {
        utf8_ptr p;
        int paren_depth, bracket_depth, brace_depth;
        int sp_cnt;

        /* if we have too many arguments, it's an error */
        if ((argc >= entry->get_argc() && !entry->has_varargs())
            || argc >= TOK_MAX_MACRO_ARGS)
        {
            /* log the error */
            log_error(TCERR_PP_MANY_MACRO_ARGS,
                      (int)entry->getlen(), entry->getstr());

            /* scan ahead to to close paren or end of line */
            while (typ != TOKT_RPAR && typ != TOKT_EOF)
                typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_,
                                   TRUE);
            
            /* done scanning arguments */
            break;
        }
        
        /* 
         *   Skip tokens until we find the end of the argument.  An argument
         *   ends at:
         *   
         *   - a comma outside of nested parens, square brackets, or curly
         *   braces
         *   
         *   - a close paren that doesn't match an open paren found earlier
         *   in the same argument
         */
        paren_depth = bracket_depth = brace_depth = 0;
        for (;;)
        {
            /* 
             *   If it's a comma, and we're not in any sort of nested
             *   brackets (parens, square brackets, or curly braces), the
             *   comma ends the argument.  A comma within any type of
             *   brackets is part of the argument text.
             */
            if (typ == TOKT_COMMA
                && paren_depth == 0 && brace_depth == 0 && bracket_depth == 0)
                break;

            /*
             *   If it's a close paren, and it doesn't match an earlier open
             *   paren in the same argument, it's the end of the argument. 
             */
            if (typ == TOKT_RPAR && paren_depth == 0)
                break;

            /* 
             *   if it's an open or close paren, brace, or bracket, adjust
             *   the depth accordingly 
             */
            switch(typ)
            {
            case TOKT_LPAR:
                ++paren_depth;
                break;

            case TOKT_RPAR:
                --paren_depth;
                break;

            case TOKT_LBRACE:
                ++brace_depth;
                break;

            case TOKT_RBRACE:
                --brace_depth;
                break;

            case TOKT_LBRACK:
                ++bracket_depth;
                break;

            case TOKT_RBRACK:
                --bracket_depth;
                break;

            default:
                break;
            }
            
            /* get the next token */
            typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_,
                               TRUE);
            
            /* 
             *   if we're at the end of the line, and we're allowed to
             *   read more, splice the next line onto the current line 
             */
            if (typ == TOKT_EOF && read_more)
            {
                /* splice a line */
                typ = actual_splice_next_line(srcbuf, src, &tok);

                /* note that we've done some line splicing */
                spliced = TRUE;
            }
            
            /* if we've reached the end of the file, stop */
            if (typ == TOKT_EOF)
                break;
        }

        /* if we've reached the end of the file, stop */
        if (typ == TOKT_EOF)
            break;

        /* remove any trailing whitespace from the actual's text */
        sp_cnt = 0;
        p.set((char *)tok.get_text());
        while (p.getptr() > srcbuf->get_text() + argofs[argc])
        {
            wchar_t ch;

            /* move to the prior character */
            p.dec();

            /* if it's not a space, stop looking */
            ch = p.getch();
            if (!is_space(ch))
            {
                /* 
                 *   advance past this character so that we keep it in the
                 *   expansion 
                 */
                p.inc();

                /* 
                 *   if this last character was a backslash, and we removed
                 *   at least one space following it, keep the one space
                 *   that immediately follows the backslash, since that
                 *   space is part of the backslash's two-character escape
                 *   sequence 
                 */
                if (ch == '\\' && sp_cnt != 0)
                    p.inc();

                /* stop scanning */
                break;
            }

            /* that's one more trailing space we've removed - count it */
            ++sp_cnt;
        }

        /* note the argument length */
        arglen[argc] = (p.getptr() - srcbuf->get_text()) - argofs[argc];

        /* count the argument */
        ++argc;
        
        /* check for another argument */
        if (typ == TOKT_COMMA)
        {
            /* remember the offset of the start of this argument */
            argofs[argc] = tok.get_text() + tok.get_text_len()
                           - srcbuf->get_text();

            /* skip the comma and go back for another argument */
            typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_,
                               TRUE);
        }
        else if (typ == TOKT_RPAR)
        {
            /* 
             *   No need to look any further.  Note that we don't want to
             *   get another token, since we're done parsing the input
             *   now, and we want to leave the token stream positioned for
             *   the caller just after the extent of the macro, which, in
             *   the case of this function-like macro, ends with the
             *   closing paren.  
             */
            break;
        }
    }

    /* if we didn't find the right paren, flag the error */
    if (typ != TOKT_RPAR)
    {
        log_error(read_more
                  ? TCERR_PP_MACRO_ARG_RPAR : TCERR_PP_MACRO_ARG_RPAR_1LINE,
                  (int)entry->getlen(), entry->getstr());
        return 1;
    }

    /* remove leading and trailing whitespace from each argument */
    for (i = 0 ; i < argc ; ++i)
    {
        const char *start;
        const char *end;
        utf8_ptr p;
        size_t del_len;
        int sp_cnt;

        /* figure the limits of the argument text */
        start = srcbuf->get_text() + argofs[i];
        end = start + arglen[i];

        /* remove leading whitespace */
        for (p.set((char *)start) ; p.getptr() < end && is_space(p.getch()) ;
             p.inc()) ;

        /* set the new offset and length */
        del_len = p.getptr() - start;
        argofs[i] += del_len;
        arglen[i] -= del_len;
        start += del_len;

        /* remove trailing whitespace */
        p.set((char *)end);
        sp_cnt = 0;
        while (p.getptr() > start)
        {
            wchar_t ch;

            /* go to the prior character */
            p.dec();

            /* if it's not whitespace, keep it */
            ch = p.getch();
            if (!is_space(ch))
            {
                /* put the character back */
                p.inc();

                /* 
                 *   if this is a backslash, and a space follows, keep the
                 *   immediately following space, since it's part of the
                 *   backslash sequence 
                 */
                if (ch == '\\' && sp_cnt != 0)
                    p.inc();

                /* we're done scanning */
                break;
            }

            /* count another removed trailing space */
            ++sp_cnt;
        }

        /* adjust the length */
        arglen[i] -= (end - p.getptr());
    }

    /* 
     *   if we did any line splicing, cut off the rest of the line and
     *   push it back into the logical input stream as a new line - this
     *   will allow better error message positioning if errors occur in
     *   the remainder of the line, since this means we'll only
     *   artificially join onto one line the part of the new line that
     *   contained the macro parameters 
     */
    if (spliced)
        unsplice_line(tok.get_text() + tok.get_text_len());
    
    /* make sure we found enough arguments */
    if (argc < entry->get_min_argc())
    {
        /* fill in the remaining arguments with empty strings */
        for ( ; argc < entry->get_argc() ; ++argc)
        {
            argofs[argc] = 0;
            arglen[argc] = 0;
        }
        
        /* note the error, but proceed with empty arguments */
        log_warning(TCERR_PP_FEW_MACRO_ARGS,
                    (int)entry->getlen(), entry->getstr());
    }

    /* 
     *   if we have varargs, always supply an empty marker for the last
     *   argument 
     */
    if (entry->has_varargs() && argc < TOK_MAX_MACRO_ARGS)
    {
        argofs[argc] = 0;
        arglen[argc] = 0;
    }

    /* success - we found an actual parameter list */
    *found_actuals = TRUE;
    return 0;
}